

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

int __thiscall f8n::db::Connection::Open(Connection *this,string *database,uint options,uint cache)

{
  int iVar1;
  
  iVar1 = sqlite3_open((database->_M_dataplus)._M_p,&this->connection);
  if (iVar1 == 0) {
    Initialize(this,cache);
  }
  return iVar1;
}

Assistant:

int Connection::Open(const std::string &database, unsigned int options, unsigned int cache) {
    int error;

    #ifdef WIN32
        std::wstring wdatabase = u8to16(database);
        error = sqlite3_open16(wdatabase.c_str(), &this->connection);
    #else
        error = sqlite3_open(database.c_str(), &this->connection);
    #endif

    if (error == SQLITE_OK) {
        this->Initialize(cache);
    }

    return error;
}